

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

TPZTransform<double> * pzshape::TPZShapeLinear::ParametricTransform(int transid)

{
  TPZFMatrix<double> *row;
  double *pdVar1;
  int in_ESI;
  TPZTransform<double> *in_RDI;
  TPZTransform<double> *trans;
  int64_t in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffc8;
  TPZTransform<double> *this;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  uint3 in_stack_fffffffffffffff0;
  
  this = in_RDI;
  TPZTransform<double>::TPZTransform
            ((TPZTransform<double> *)CONCAT44(in_ESI,(uint)in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  if (in_ESI == 0) {
    row = TPZTransform<double>::Mult(this);
    pdVar1 = TPZFMatrix<double>::operator()
                       ((TPZFMatrix<double> *)this,(int64_t)row,in_stack_ffffffffffffffc0);
    *pdVar1 = 1.0;
  }
  else {
    TPZTransform<double>::Mult(this);
    pdVar1 = TPZFMatrix<double>::operator()
                       ((TPZFMatrix<double> *)this,in_stack_ffffffffffffffc8,
                        in_stack_ffffffffffffffc0);
    *pdVar1 = -1.0;
  }
  return in_RDI;
}

Assistant:

TPZTransform<REAL> TPZShapeLinear::ParametricTransform(int transid) {
        TPZTransform<REAL> trans(1,1);
        if (!transid) trans.Mult()(0,0) =  1;
        else          trans.Mult()(0,0) = -1;
        return trans;
    }